

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxSteepPR<double>::selectEnterDenseDim(SPxSteepPR<double> *this,double *best,double tol)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  SPxSolverBase<double> *pSVar4;
  pointer pdVar5;
  pointer pdVar6;
  DataKey DVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  pdVar5 = (pSVar4->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pSVar4->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (pSVar4->thecovectors->set).thenum;
  uVar10 = 0;
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar9 = uVar10;
  }
  uVar8 = 0xffffffffffffffff;
  DVar7.info = 0;
  DVar7.idx = 0;
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    dVar1 = pdVar5[uVar10];
    if (dVar1 < -tol) {
      dVar2 = pdVar6[uVar10];
      dVar11 = tol;
      if (tol <= dVar2) {
        dVar11 = dVar2;
      }
      dVar11 = (dVar1 * dVar1) / dVar11;
      if (*best <= dVar11 && dVar11 != *best) {
        *best = dVar11;
        DVar7 = (DataKey)SPxSolverBase<double>::coId
                                   ((this->super_SPxPricer<double>).thesolver,(int)uVar10);
        uVar8 = (ulong)DVar7 >> 0x20;
      }
    }
  }
  return (SPxId)((ulong)DVar7 & 0xffffffff | uVar8 << 0x20);
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterDenseDim(R& best, R tol)
{
   SPxId enterId;
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R x;

   for(int i = 0, end = this->thesolver->dim(); i < end; ++i)
   {
      x = coTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            enterId = this->thesolver->coId(i);
         }
      }
   }

   return enterId;
}